

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O0

SplittingStepCoefficients
SplittingStepCoefficients_LoadCoefficients(ARKODE_SplittingCoefficientsID method)

{
  int in_EDI;
  double dVar1;
  int unaff_retaddr;
  SplittingStepCoefficients coefficients_1;
  SplittingStepCoefficients coefficients;
  undefined8 in_stack_ffffffffffffffe8;
  SplittingStepCoefficients local_8;
  
  if (in_EDI + 1U < 7 || in_EDI == 6) {
    switch((long)&switchD_0019479f::switchdataD_001ceed8 +
           (long)(int)(&switchD_0019479f::switchdataD_001ceed8)[in_EDI + 1U]) {
    case 0x1947a1:
      local_8 = (SplittingStepCoefficients)0x0;
      break;
    case 0x1947af:
      local_8 = SplittingStepCoefficients_LieTrotter
                          ((int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
      break;
    case 0x1947c3:
      local_8 = SplittingStepCoefficients_Strang(0);
      break;
    case 0x1947d7:
      local_8 = SplittingStepCoefficients_Alloc
                          (coefficients_1._4_4_,(int)coefficients_1,unaff_retaddr);
      local_8->order = 2;
      *local_8->alpha = 1.0;
      dVar1 = sqrt(0.5);
      *(*local_8->beta)[1] = 1.0 - dVar1;
      dVar1 = sqrt(0.5);
      (*local_8->beta)[1][1] = dVar1;
      *(*local_8->beta)[2] = 1.0;
      (*local_8->beta)[2][1] = 1.0;
      break;
    case 0x1948a7:
      local_8 = SplittingStepCoefficients_ThirdOrderSuzuki(method);
      break;
    case 0x1948bb:
      local_8 = SplittingStepCoefficients_Alloc
                          (coefficients_1._4_4_,(int)coefficients_1,unaff_retaddr);
      local_8->order = 3;
      *local_8->alpha = 1.0;
      *(*local_8->beta)[1] = 1.0;
      (*local_8->beta)[1][1] = -0.041666666666666664;
      *(*local_8->beta)[2] = 0.3333333333333333;
      (*local_8->beta)[2][1] = 0.7083333333333334;
      *(*local_8->beta)[3] = 1.0;
      (*local_8->beta)[3][1] = 1.0;
      break;
    case 0x1949ab:
      local_8 = SplittingStepCoefficients_TripleJump(0,0x1949ba);
      break;
    case 0x1949c1:
      local_8 = SplittingStepCoefficients_TripleJump(0,0x1949d0);
    }
  }
  else {
    arkProcessError((ARKodeMem)0x0,-0x16,0xb7,"SplittingStepCoefficients_LoadCoefficients",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep_coefficients.c"
                    ,"Unknown splitting coefficients");
    local_8 = (SplittingStepCoefficients)0x0;
  }
  return local_8;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_LoadCoefficients(
  const ARKODE_SplittingCoefficientsID method)
{
  switch (method)
  {
#define ARK_SPLITTING_COEFFICIENTS(name, coeff) \
  case name: coeff break;
#include "arkode_splittingstep_coefficients.def"
#undef ARK_SPLITTING_COEFFICIENTS

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown splitting coefficients");
    return NULL;
  }
}